

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_u32.cpp
# Opt level: O0

void T_UConverter_fromUnicode_UTF32_BE(UConverterFromUnicodeArgs *args,UErrorCode *err)

{
  uint8_t uVar1;
  char cVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UConverter *pUVar5;
  UBool UVar6;
  uchar *puVar7;
  uint8_t local_48;
  byte local_47;
  undefined1 local_46;
  undefined1 local_45;
  uint local_44;
  uchar temp [4];
  uint indexToWrite;
  UChar32 ch2;
  UChar32 ch;
  uchar *targetLimit;
  UChar *sourceLimit;
  uchar *myTarget;
  UChar *mySource;
  UErrorCode *err_local;
  UConverterFromUnicodeArgs *args_local;
  
  myTarget = (uchar *)args->source;
  pUVar3 = args->sourceLimit;
  pUVar4 = (UChar *)args->targetLimit;
  if (myTarget < pUVar3) {
    if (args->converter->fromUnicodeStatus == 1) {
      ucnv_fromUWriteBytes_63
                (args->converter,"",4,&args->target,args->targetLimit,&args->offsets,-1,err);
      args->converter->fromUnicodeStatus = 0;
    }
    sourceLimit = (UChar *)args->target;
    local_48 = '\0';
    if (args->converter->fromUChar32 == 0) goto LAB_0037fcd0;
    indexToWrite = args->converter->fromUChar32;
    args->converter->fromUChar32 = 0;
    do {
      if (pUVar3 <= myTarget) {
        args->converter->fromUChar32 = indexToWrite;
        if (args->flush != '\0') {
          *err = U_ILLEGAL_CHAR_FOUND;
        }
        goto LAB_0037fe7c;
      }
      temp[2] = '\0';
      temp[3] = '\0';
      temp._0_2_ = *(ushort *)myTarget;
      if (((uint)temp & 0xfffffc00) != 0xdc00) {
        args->converter->fromUChar32 = indexToWrite;
        *err = U_ILLEGAL_CHAR_FOUND;
        goto LAB_0037fe7c;
      }
      indexToWrite = (indexToWrite - 0xd800) * 0x400 + (int)temp + 0x2400;
      myTarget = myTarget + 2;
      do {
        local_47 = (byte)(indexToWrite >> 0x10) & 0x1f;
        local_46 = (char)(indexToWrite >> 8);
        local_45 = (char)indexToWrite;
        for (local_44 = 0; local_44 < 4; local_44 = local_44 + 1) {
          if (sourceLimit < pUVar4) {
            *(uint8_t *)sourceLimit = (&local_48)[local_44];
            sourceLimit = (UChar *)((long)sourceLimit + 1);
          }
          else {
            uVar1 = (&local_48)[local_44];
            pUVar5 = args->converter;
            cVar2 = args->converter->charErrorBufferLength;
            args->converter->charErrorBufferLength = cVar2 + '\x01';
            pUVar5->charErrorBuffer[cVar2] = uVar1;
            *err = U_BUFFER_OVERFLOW_ERROR;
          }
        }
LAB_0037fcd0:
        if (pUVar3 <= myTarget || pUVar4 <= sourceLimit) goto LAB_0037fe7c;
        puVar7 = myTarget + 2;
        indexToWrite = (uint)*(ushort *)myTarget;
        myTarget = puVar7;
      } while ((indexToWrite & 0xfffff800) != 0xd800);
    } while ((indexToWrite & 0xfffffc00) == 0xd800);
    args->converter->fromUChar32 = indexToWrite;
    *err = U_ILLEGAL_CHAR_FOUND;
LAB_0037fe7c:
    if (((myTarget < pUVar3) && (pUVar4 <= sourceLimit)) && (UVar6 = U_SUCCESS(*err), UVar6 != '\0')
       ) {
      *err = U_BUFFER_OVERFLOW_ERROR;
    }
    args->target = (char *)sourceLimit;
    args->source = (UChar *)myTarget;
  }
  return;
}

Assistant:

static void U_CALLCONV
T_UConverter_fromUnicode_UTF32_BE(UConverterFromUnicodeArgs * args,
                                  UErrorCode * err)
{
    const UChar *mySource = args->source;
    unsigned char *myTarget;
    const UChar *sourceLimit = args->sourceLimit;
    const unsigned char *targetLimit = (unsigned char *) args->targetLimit;
    UChar32 ch, ch2;
    unsigned int indexToWrite;
    unsigned char temp[sizeof(uint32_t)];

    if(mySource >= sourceLimit) {
        /* no input, nothing to do */
        return;
    }

    /* write the BOM if necessary */
    if(args->converter->fromUnicodeStatus==UCNV_NEED_TO_WRITE_BOM) {
        static const char bom[]={ 0, 0, (char)0xfeu, (char)0xffu };
        ucnv_fromUWriteBytes(args->converter,
                             bom, 4,
                             &args->target, args->targetLimit,
                             &args->offsets, -1,
                             err);
        args->converter->fromUnicodeStatus=0;
    }

    myTarget = (unsigned char *) args->target;
    temp[0] = 0;

    if (args->converter->fromUChar32) {
        ch = args->converter->fromUChar32;
        args->converter->fromUChar32 = 0;
        goto lowsurogate;
    }

    while (mySource < sourceLimit && myTarget < targetLimit) {
        ch = *(mySource++);

        if (U_IS_SURROGATE(ch)) {
            if (U_IS_LEAD(ch)) {
lowsurogate:
                if (mySource < sourceLimit) {
                    ch2 = *mySource;
                    if (U_IS_TRAIL(ch2)) {
                        ch = ((ch - SURROGATE_HIGH_START) << HALF_SHIFT) + ch2 + SURROGATE_LOW_BASE;
                        mySource++;
                    }
                    else {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        args->converter->fromUChar32 = ch;
                        *err = U_ILLEGAL_CHAR_FOUND;
                        break;
                    }
                }
                else {
                    /* ran out of source */
                    args->converter->fromUChar32 = ch;
                    if (args->flush) {
                        /* this is an unmatched trail code unit (2nd surrogate) */
                        /* callback(illegal) */
                        *err = U_ILLEGAL_CHAR_FOUND;
                    }
                    break;
                }
            }
            else {
                /* this is an unmatched trail code unit (2nd surrogate) */
                /* callback(illegal) */
                args->converter->fromUChar32 = ch;
                *err = U_ILLEGAL_CHAR_FOUND;
                break;
            }
        }

        /* We cannot get any larger than 10FFFF because we are coming from UTF-16 */
        temp[1] = (uint8_t) (ch >> 16 & 0x1F);
        temp[2] = (uint8_t) (ch >> 8);  /* unsigned cast implicitly does (ch & FF) */
        temp[3] = (uint8_t) (ch);       /* unsigned cast implicitly does (ch & FF) */

        for (indexToWrite = 0; indexToWrite <= sizeof(uint32_t) - 1; indexToWrite++) {
            if (myTarget < targetLimit) {
                *(myTarget++) = temp[indexToWrite];
            }
            else {
                args->converter->charErrorBuffer[args->converter->charErrorBufferLength++] = temp[indexToWrite];
                *err = U_BUFFER_OVERFLOW_ERROR;
            }
        }
    }

    if (mySource < sourceLimit && myTarget >= targetLimit && U_SUCCESS(*err)) {
        *err = U_BUFFER_OVERFLOW_ERROR;
    }

    args->target = (char *) myTarget;
    args->source = mySource;
}